

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O0

size_t __thiscall io_buf::buf_read(io_buf *this,char **pointer,size_t n)

{
  char *pcVar1;
  char **ppcVar2;
  ssize_t sVar3;
  ulong uVar4;
  size_t sVar5;
  char **in_RDX;
  io_buf *in_RSI;
  long in_RDI;
  int unaff_retaddr;
  io_buf *in_stack_00000008;
  size_t left;
  size_t in_stack_ffffffffffffffd8;
  char **local_8;
  
  pcVar1 = (char *)(*(long *)(in_RDI + 0x60) + (long)in_RDX);
  ppcVar2 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
  if (*ppcVar2 < pcVar1) {
    pcVar1 = *(char **)(in_RDI + 0x60);
    ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
    if (pcVar1 != *ppcVar2) {
      ppcVar2 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
      in_stack_ffffffffffffffd8 = (long)*ppcVar2 - *(long *)(in_RDI + 0x60);
      ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
      memmove(*ppcVar2,*(void **)(in_RDI + 0x60),in_stack_ffffffffffffffd8);
      ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
      *(char **)(in_RDI + 0x60) = *ppcVar2;
      ppcVar2 = v_array<char>::begin((v_array<char> *)(in_RDI + 0x10));
      pcVar1 = *ppcVar2 + in_stack_ffffffffffffffd8;
      ppcVar2 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
      *ppcVar2 = pcVar1;
    }
    v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x30),*(size_t *)(in_RDI + 0x58));
    sVar3 = fill(in_stack_00000008,unaff_retaddr);
    if (sVar3 < 1) {
      uVar4 = *(long *)(in_RDI + 0x58) + 1;
      *(ulong *)(in_RDI + 0x58) = uVar4;
      sVar5 = v_array<int>::size((v_array<int> *)(in_RDI + 0x30));
      if (uVar4 < sVar5) {
        local_8 = (char **)buf_read(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      }
      else {
        in_RSI->_vptr_io_buf = *(_func_int ***)(in_RDI + 0x60);
        ppcVar2 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
        *(char **)(in_RDI + 0x60) = *ppcVar2;
        ppcVar2 = v_array<char>::end((v_array<char> *)(in_RDI + 0x10));
        local_8 = (char **)(*ppcVar2 + -(long)in_RSI->_vptr_io_buf);
      }
    }
    else {
      local_8 = (char **)buf_read(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    }
  }
  else {
    in_RSI->_vptr_io_buf = *(_func_int ***)(in_RDI + 0x60);
    *(char **)(in_RDI + 0x60) = (char *)((long)in_RDX + *(long *)(in_RDI + 0x60));
    local_8 = in_RDX;
  }
  return (size_t)local_8;
}

Assistant:

size_t io_buf::buf_read(char*& pointer, size_t n)
{
  // return a pointer to the next n bytes.  n must be smaller than the maximum size.
  if (head + n <= space.end())
  {
    pointer = head;
    head += n;
    return n;
  }
  else  // out of bytes, so refill.
  {
    if (head != space.begin())  // There exists room to shift.
    {
      // Out of buffer so swap to beginning.
      size_t left = space.end() - head;
      memmove(space.begin(), head, left);
      head = space.begin();
      space.end() = space.begin() + left;
    }
    if (fill(files[current]) > 0)   // read more bytes from current file if present
      return buf_read(pointer, n);  // more bytes are read.
    else if (++current < files.size())
      return buf_read(pointer, n);  // No more bytes, so go to next file and try again.
    else
    {
      // no more bytes to read, return all that we have left.
      pointer = head;
      head = space.end();
      return space.end() - pointer;
    }
  }
}